

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O2

void __thiscall psy::TextElement::TextElement(TextElement *this,char *chars,uint size)

{
  uint uVar1;
  char *__dest;
  
  this->_vptr_TextElement = (_func_int **)&PTR__TextElement_001398d0;
  this->size_ = size;
  __dest = (char *)operator_new__((ulong)(size + 1));
  this->chars_ = __dest;
  this->next_ = (TextElement *)0x0;
  strncpy(__dest,chars,(ulong)size);
  __dest[size] = '\0';
  uVar1 = hashCode(__dest,size);
  this->hashCode_ = uVar1;
  return;
}

Assistant:

TextElement::TextElement(const char* chars, unsigned int size)
    : size_(size)
    , chars_(new char[size + 1])
    , next_(nullptr)
{
    std::strncpy(chars_, chars, size);
    chars_[size] = 0;
    hashCode_ = hashCode(chars_, size_);
}